

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,REF_INT faceid)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_LIST pRVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  REF_GRID pRVar12;
  REF_INT RVar13;
  long lVar14;
  REF_INT face_nodes [4];
  REF_BOOL reversed;
  REF_INT tet0;
  REF_INT seg_nodes [3];
  REF_INT tet1;
  uint local_88;
  int local_84;
  REF_GRID local_80;
  uint local_78;
  REF_INT local_74;
  ulong local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  REF_BOOL local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  local_40 = ref_cavity->node;
  pRVar8 = ref_cavity->tri_list;
  local_74 = faceid;
  if (0 < pRVar8->n) {
    pRVar12 = ref_cavity->ref_grid;
    ref_cell = pRVar12->cell[8];
    lVar14 = 0;
    do {
      pRVar2 = pRVar12->cell[3]->c2n;
      lVar9 = (long)pRVar12->cell[3]->size_per * (long)pRVar8->value[lVar14];
      local_68 = pRVar2[lVar9];
      local_64 = pRVar2[lVar9 + 1];
      local_60 = pRVar2[lVar9 + 2];
      local_5c = local_68;
      uVar5 = ref_cell_with_face(ref_cell,(REF_INT *)&local_68,&local_50,&local_3c);
      iVar1 = local_3c;
      if (uVar5 == 0) {
        if (local_50 != -1) {
          if ((long)local_3c != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x3fc,"ref_cavity_form_insert2_tet","tet1 found",0xffffffffffffffff,
                   (long)local_3c);
            local_88 = 1;
          }
          if (iVar1 == -1) {
            uVar6 = ref_cavity_add_tet_without_faceid(ref_cavity,local_50,local_74);
            uVar5 = local_68;
            if (uVar6 == 0) {
              uVar10 = (ulong)local_68;
              local_4c = local_68;
              local_78 = local_64;
              local_48 = local_64;
              uVar6 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_4c,&local_84,&local_54);
              if ((uVar6 != 0) && (uVar6 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x403,"ref_cavity_form_insert2_tet",(ulong)uVar6,"find existing");
                local_88 = uVar6;
              }
              if ((uVar6 == 5) || (uVar6 == 0)) {
                if (local_84 == -1) {
                  uVar11 = 0xffffffff;
                  if (-1 < (int)uVar5) {
                    uVar11 = 0xffffffff;
                    if ((int)uVar5 < ref_cell->ref_adj->nnode) {
                      uVar11 = (ulong)(uint)ref_cell->ref_adj->first[uVar10];
                    }
                  }
                  if ((int)uVar11 != -1) {
                    RVar13 = ref_cell->ref_adj->item[(int)uVar11].ref;
                    local_80 = pRVar12;
                    do {
                      local_70 = uVar11;
                      if (0 < ref_cell->node_per) {
                        lVar9 = 0;
                        do {
                          if ((local_78 ==
                               ref_cell->c2n[(long)RVar13 * (long)ref_cell->size_per + lVar9]) &&
                             (uVar5 = ref_cavity_add_tet_without_faceid(ref_cavity,RVar13,local_74),
                             uVar5 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x408,"ref_cavity_form_insert2_tet",(ulong)uVar5,
                                   "add interior tet face");
                            local_88 = uVar5;
                            goto LAB_00132ffa;
                          }
                          lVar9 = lVar9 + 1;
                        } while ((int)lVar9 < ref_cell->node_per);
                      }
                      pRVar3 = ref_cell->ref_adj->item;
                      iVar1 = pRVar3[(int)local_70].next;
                      uVar11 = (ulong)iVar1;
                      if (uVar11 == 0xffffffffffffffff) {
                        RVar13 = -1;
                      }
                      else {
                        RVar13 = pRVar3[uVar11].ref;
                      }
                      pRVar12 = local_80;
                    } while (iVar1 != -1);
                  }
                }
                uVar5 = local_64;
                uVar10 = (ulong)local_64;
                local_4c = local_64;
                local_78 = local_60;
                local_48 = local_60;
                uVar6 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_4c,&local_84,&local_54);
                if ((uVar6 != 0) && (uVar6 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x40f,"ref_cavity_form_insert2_tet",(ulong)uVar6,"find existing");
                  local_88 = uVar6;
                }
                if ((uVar6 == 5) || (uVar6 == 0)) {
                  if (local_84 == -1) {
                    local_70 = 0xffffffff;
                    if (-1 < (int)uVar5) {
                      local_70 = 0xffffffff;
                      if ((int)uVar5 < ref_cell->ref_adj->nnode) {
                        local_70 = (ulong)(uint)ref_cell->ref_adj->first[uVar10];
                      }
                    }
                    if ((int)local_70 != -1) {
                      RVar13 = ref_cell->ref_adj->item[(int)local_70].ref;
                      local_80 = pRVar12;
                      do {
                        if (0 < ref_cell->node_per) {
                          lVar9 = 0;
                          do {
                            if ((local_78 ==
                                 ref_cell->c2n[(long)RVar13 * (long)ref_cell->size_per + lVar9]) &&
                               (uVar5 = ref_cavity_add_tet_without_faceid
                                                  (ref_cavity,RVar13,local_74), uVar5 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x414,"ref_cavity_form_insert2_tet",(ulong)uVar5,
                                     "add interior tet face");
                              local_88 = uVar5;
                              goto LAB_00132ffa;
                            }
                            lVar9 = lVar9 + 1;
                          } while ((int)lVar9 < ref_cell->node_per);
                        }
                        pRVar3 = ref_cell->ref_adj->item;
                        iVar1 = pRVar3[(int)local_70].next;
                        local_70 = (ulong)iVar1;
                        if (local_70 == 0xffffffffffffffff) {
                          RVar13 = -1;
                        }
                        else {
                          RVar13 = pRVar3[local_70].ref;
                        }
                        pRVar12 = local_80;
                      } while (iVar1 != -1);
                    }
                  }
                  local_70 = (ulong)local_60;
                  local_4c = local_60;
                  local_78 = local_68;
                  local_48 = local_68;
                  uVar5 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_4c,&local_84,&local_54);
                  if ((uVar5 != 0) && (uVar5 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x41b,"ref_cavity_form_insert2_tet",(ulong)uVar5,"find existing");
                    local_88 = uVar5;
                  }
                  if ((uVar5 == 5) || (uVar5 == 0)) {
                    bVar4 = true;
                    if (local_84 == -1) {
                      uVar10 = 0xffffffff;
                      if (-1 < (int)local_70) {
                        uVar10 = 0xffffffff;
                        if ((int)local_70 < ref_cell->ref_adj->nnode) {
                          uVar10 = (ulong)(uint)ref_cell->ref_adj->first[local_70];
                        }
                      }
                      if ((int)uVar10 != -1) {
                        RVar13 = ref_cell->ref_adj->item[(int)uVar10].ref;
                        local_80 = pRVar12;
                        do {
                          local_38 = uVar10;
                          if (0 < ref_cell->node_per) {
                            lVar9 = 0;
                            local_70 = CONCAT44(local_70._4_4_,RVar13);
LAB_00132d1b:
                            if (local_78 !=
                                ref_cell->c2n[(long)RVar13 * (long)ref_cell->size_per + lVar9])
                            goto LAB_00132d86;
                            uVar5 = ref_cavity_add_tet_without_faceid(ref_cavity,RVar13,local_74);
                            if (uVar5 == 0) {
                              RVar13 = (int)local_70;
                              goto LAB_00132d86;
                            }
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x420,"ref_cavity_form_insert2_tet",(ulong)uVar5,
                                   "add interior tet face");
                            local_88 = uVar5;
LAB_00132ffa:
                            bVar4 = false;
                            pRVar12 = local_80;
                            break;
                          }
LAB_00132d8f:
                          pRVar3 = ref_cell->ref_adj->item;
                          iVar1 = pRVar3[(int)local_38].next;
                          uVar10 = (ulong)iVar1;
                          if (uVar10 == 0xffffffffffffffff) {
                            RVar13 = -1;
                          }
                          else {
                            RVar13 = pRVar3[uVar10].ref;
                          }
                          pRVar12 = local_80;
                        } while (iVar1 != -1);
                      }
                    }
                    goto LAB_00132a66;
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3fe,"ref_cavity_form_insert2_tet",(ulong)uVar6,"add interior tet face");
              local_88 = uVar6;
            }
          }
          goto LAB_00132a63;
        }
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3fb,"ref_cavity_form_insert2_tet","tet0 not found");
        local_88 = 1;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3fa,"ref_cavity_form_insert2_tet",(ulong)uVar5,"tet");
        local_88 = uVar5;
LAB_00132a63:
        bVar4 = false;
      }
LAB_00132a66:
      if (!bVar4) {
        return local_88;
      }
      lVar14 = lVar14 + 1;
      pRVar8 = ref_cavity->tri_list;
    } while (lVar14 < pRVar8->n);
  }
  if (ref_cavity->maxseg < 1) {
    lVar14 = 0;
  }
  else {
    lVar9 = 4;
    lVar14 = 0;
    do {
      uVar5 = *(uint *)((long)ref_cavity->s2n + lVar9 + -4);
      if (uVar5 != 0xffffffff) {
        local_64 = *(uint *)((long)ref_cavity->s2n + lVar9);
        local_60 = local_40;
        local_68 = uVar5;
        uVar5 = ref_cavity_insert_face(ref_cavity,(REF_INT *)&local_68);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x429,"ref_cavity_form_insert2_tet",(ulong)uVar5,"tet side");
          return uVar5;
        }
      }
      lVar14 = lVar14 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar14 < ref_cavity->maxseg);
  }
  local_84 = (int)lVar14;
  if (ref_cavity->debug != 0) {
    ref_cavity_tec(ref_cavity,"form-tet.tec");
  }
  if (ref_cavity->debug != 0) {
    printf("insert face form state %d\n",(ulong)ref_cavity->state);
  }
  RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
  if (RVar7 == 0) {
    if (ref_cavity->debug == 0) {
      RVar7 = 0;
    }
    else {
      RVar7 = 0;
      printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
    }
  }
  else {
    RVar7 = 1;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x430,
           "ref_cavity_form_insert2_tet",1,"ball face manifold");
  }
  return RVar7;
LAB_00132d86:
  lVar9 = lVar9 + 1;
  if (ref_cell->node_per <= (int)lVar9) goto LAB_00132d8f;
  goto LAB_00132d1b;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,
                                               REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_CELL ref_cell;
  REF_INT item;
  REF_INT face_nodes[4], seg_nodes[3], seg;
  /* add tets off wall from seg */
  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    REF_INT tet0, tet1, tet, cell_item, cell_node;
    REF_INT tri;
    REF_BOOL reversed;
    tri = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    face_nodes[0] = ref_cell_c2n(ref_grid_tri(ref_grid), 0, tri);
    face_nodes[1] = ref_cell_c2n(ref_grid_tri(ref_grid), 1, tri);
    face_nodes[2] = ref_cell_c2n(ref_grid_tri(ref_grid), 2, tri);
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(ref_cell, face_nodes, &tet0, &tet1), "tet");
    RUS(REF_EMPTY, tet0, "tet0 not found");
    REIS(REF_EMPTY, tet1, "tet1 found");
    RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet0, faceid),
        "add interior tet face");

    seg_nodes[0] = face_nodes[0];
    seg_nodes[1] = face_nodes[1];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[1];
    seg_nodes[1] = face_nodes[2];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[2];
    seg_nodes[1] = face_nodes[0];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }
  }

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    face_nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    face_nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    face_nodes[2] = node;
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tet.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert face form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}